

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
benchmark::internal::anon_unknown_7::CreateReporter(string *name,OutputOptions allow_color)

{
  bool bVar1;
  CSVReporter *this;
  ostream *poVar2;
  string *in_RSI;
  __uniq_ptr_data<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>,_true,_true>
  in_RDI;
  undefined4 in_stack_ffffffffffffffa8;
  OutputOptions in_stack_ffffffffffffffac;
  ConsoleReporter *in_stack_ffffffffffffffb0;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffffb0,
                          (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (bVar1) {
    operator_new(0x28);
    ConsoleReporter::ConsoleReporter(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    std::unique_ptr<benchmark::BenchmarkReporter,std::default_delete<benchmark::BenchmarkReporter>>
    ::unique_ptr<std::default_delete<benchmark::BenchmarkReporter>,void>
              ((unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                *)in_stack_ffffffffffffffb0,
               (pointer)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffffb0,
                            (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (bVar1) {
      operator_new(0x20);
      JSONReporter::JSONReporter((JSONReporter *)in_stack_ffffffffffffffb0);
      std::
      unique_ptr<benchmark::BenchmarkReporter,std::default_delete<benchmark::BenchmarkReporter>>::
      unique_ptr<std::default_delete<benchmark::BenchmarkReporter>,void>
                ((unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                  *)in_stack_ffffffffffffffb0,
                 (pointer)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffffb0,
                              (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
      ;
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unexpected format: \'");
        poVar2 = std::operator<<(poVar2,in_RSI);
        std::operator<<(poVar2,"\'\n");
        exit(1);
      }
      this = (CSVReporter *)operator_new(0x18);
      CSVReporter::CSVReporter(this);
      std::
      unique_ptr<benchmark::BenchmarkReporter,std::default_delete<benchmark::BenchmarkReporter>>::
      unique_ptr<std::default_delete<benchmark::BenchmarkReporter>,void>
                ((unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                  *)this,(pointer)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
  }
  return (__uniq_ptr_data<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>,_true,_true>
          )(tuple<benchmark::BenchmarkReporter_*,_std::default_delete<benchmark::BenchmarkReporter>_>
            )in_RDI.
             super___uniq_ptr_impl<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
             ._M_t.
             super__Tuple_impl<0UL,_benchmark::BenchmarkReporter_*,_std::default_delete<benchmark::BenchmarkReporter>_>
             .super__Head_base<0UL,_benchmark::BenchmarkReporter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<BenchmarkReporter>
CreateReporter(std::string const& name, ConsoleReporter::OutputOptions allow_color) {
  typedef std::unique_ptr<BenchmarkReporter> PtrType;
  if (name == "console") {
    return PtrType(new ConsoleReporter(allow_color));
  } else if (name == "json") {
    return PtrType(new JSONReporter);
  } else if (name == "csv") {
    return PtrType(new CSVReporter);
  } else {
    std::cerr << "Unexpected format: '" << name << "'\n";
    std::exit(1);
  }
}